

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OmegaSN.cpp
# Opt level: O0

void __thiscall OmegaSN::algoISOTONIC(OmegaSN *this,vector<double,_std::allocator<double>_> *data)

{
  double dVar1;
  size_type sVar2;
  double **ppdVar3;
  double dVar4;
  uint local_64;
  uint local_60;
  uint u;
  uint t;
  uint v;
  uint nb;
  uint T;
  uint temp_indState;
  int temp_chpt;
  double temp_Q;
  double temp_cost;
  uint local_30;
  int iStack_2c;
  Costs cost;
  uint p;
  uint n;
  vector<double,_std::allocator<double>_> *data_local;
  OmegaSN *this_local;
  
  sVar2 = std::vector<double,_std::allocator<double>_>::size(data);
  iStack_2c = (int)sVar2;
  local_30 = this->nbStates;
  Costs::Costs((Costs *)((long)&temp_cost + 7));
  temp_Q = 0.0;
  _temp_indState = -1.0;
  T = 0xffffffff;
  nb = 0;
  ppdVar3 = preprocessing(this,data);
  this->S12P = ppdVar3;
  Q0init(this,data);
  for (v = 2; v < iStack_2c + 1U; v = v + 1) {
    for (t = 1; t < this->nbSegments; t = t + 1) {
      for (u = 0; u < local_30; u = u + 1) {
        _temp_indState = INFINITY;
        nb = 0;
        T = 0;
        local_60 = t;
        while (local_60 = local_60 + 1, local_60 < v) {
          for (local_64 = 0; local_64 < u + 1; local_64 = local_64 + 1) {
            dVar1 = this->Q[t - 1][local_64][local_60];
            dVar4 = Costs::slopeCost((Costs *)((long)&temp_cost + 7),this->states + local_64,
                                     this->states + u,&local_60,&v,*this->S12P + local_60,
                                     *this->S12P + v,this->S12P[1] + local_60,this->S12P[1] + v,
                                     this->S12P[2] + local_60,this->S12P[2] + v);
            temp_Q = dVar1 + dVar4;
            if (temp_Q < _temp_indState) {
              nb = local_64;
              T = local_60;
              _temp_indState = temp_Q;
            }
          }
        }
        this->Q[t][u][v] = _temp_indState;
        this->lastChpt[t][u][v] = T;
        this->lastIndState[t][u][v] = nb;
      }
    }
  }
  this->pruning = 1.0;
  return;
}

Assistant:

void OmegaSN::algoISOTONIC(std::vector< double >& data)
{
  unsigned int n = data.size();
  unsigned int p = nbStates;
  Costs cost;
  double temp_cost = 0;
  double temp_Q = -1;
  int temp_chpt = -1;
  unsigned int temp_indState = 0;

  /// PREPROCESSING
  S12P = preprocessing(data);
  Q0init(data);

  /// ALGO
  /// states u to v -> time position t to T
  /// explore in (u,t) for fixed (v,T)
  for(unsigned int T = 2; T < (n + 1); T++)
  {
    for(unsigned int nb = 1; nb < nbSegments; nb++)
    {
      for(unsigned int v = 0; v < p; v++)
      {
        ///// EXPLORE MATRIX size p*T
        temp_Q = INFINITY;
        temp_indState = 0;
        temp_chpt = 0;

        for(unsigned int t = nb + 1; t < T; t++)
        {
          for(unsigned int u = 0; u < (v + 1); u++) /////explore column of states
          {
            temp_cost = Q[nb-1][u][t] + cost.slopeCost(states[u], states[v], t, T, S12P[0][t], S12P[0][T], S12P[1][t], S12P[1][T], S12P[2][t], S12P[2][T]);
            if(temp_Q > temp_cost)
            {
              temp_Q = temp_cost;
              temp_indState = u;
              temp_chpt = t;
            }
          }
        }
        ///// Write response
        Q[nb][v][T] = temp_Q;
        lastChpt[nb][v][T] = temp_chpt;
        lastIndState[nb][v][T] = temp_indState;
        //std::cout << "nb " << nb << " v "<< v << " T " << T << " Q " << temp_Q << " --- " << temp_indState << " && " << temp_chpt << std::endl;
      }
    }
  }
  pruning = 1;

}